

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# app_proto.c
# Opt level: O2

byte_req_pair stss_consume_response(application_protocol *proto,iovec *response)

{
  ulong uVar1;
  ulong uVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  byte_req_pair bVar6;
  
  uVar1 = response->iov_len;
  if (uVar1 < 8) {
    __assert_fail("response->iov_len >= sizeof(long)",
                  "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/app_proto.c"
                  ,0xcf,
                  "struct byte_req_pair stss_consume_response(struct application_protocol *, struct iovec *)"
                 );
  }
  uVar4 = 0;
  uVar3 = 0;
  lVar5 = 0;
  do {
    uVar2 = *(ulong *)((long)response->iov_base + (long)(int)lVar5);
    lVar5 = (long)((int)lVar5 + 8);
    if (uVar2 < uVar1 - lVar5) break;
    lVar5 = lVar5 + uVar2;
    uVar4 = uVar4 + 1;
    uVar3 = uVar3 + uVar2 + 8;
  } while (uVar1 - (long)(int)lVar5 < 9);
  bVar6.reqs = uVar4;
  bVar6.bytes = uVar3;
  return bVar6;
}

Assistant:

struct byte_req_pair stss_consume_response(struct application_protocol *proto,
		struct iovec *response)
{
	struct byte_req_pair res = {0};
	long *payload_size;
	char *tmp;
	int processed;

	assert(response->iov_len >= sizeof(long));
	tmp = response->iov_base;
	while (1) {
		payload_size = (long *)&tmp[processed];
		processed += sizeof(long);
		if (*payload_size < (response->iov_len - processed))
			break;
		processed += *payload_size;
		res.reqs += 1;
		res.bytes += (sizeof(long) + *payload_size);
		if (sizeof(long) < (response->iov_len - processed))
			break;
	}
	return res;
}